

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

void lscpp::protocol::serializer_impl_::from_optional<std::__cxx11::string>
               (json *j,string *key,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *to)

{
  bool bVar1;
  const_reference j_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  string_t local_38;
  
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains(j,key);
  if (bVar1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    j_00 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](j,key);
    nlohmann::json_abi_v3_11_2::detail::
    from_json<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (j_00,&local_38);
    std::optional<std::__cxx11::string>::operator=((optional<std::__cxx11::string> *)to,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void from_optional(const nlohmann::json &j, std::string const &key,
                   std::optional<T> &to) {
  if (j.contains(key)) {
    T v;
    j[key].get_to(v);
    to = v;
  }
}